

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * __thiscall
tinyusdz::print_typed_attr<std::array<float,3ul>>
          (string *__return_storage_ptr__,tinyusdz *this,
          TypedAttribute<tinyusdz::Animatable<std::array<float,_3UL>_>_> *attr,string *name,
          uint32_t indent)

{
  bool bVar1;
  AttrMeta *pAVar2;
  ostream *poVar3;
  value_type *pvVar4;
  TypedTimeSamples<std::array<float,_3UL>_> *this_00;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *this_01;
  size_type sVar5;
  const_reference v;
  uint uVar6;
  undefined3 uVar7;
  uint32_t indent_00;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t uVar8;
  uint32_t n;
  uint32_t extraout_EDX_01;
  uint32_t n_00;
  bool local_343;
  bool local_342;
  bool local_341;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *paths;
  string local_308;
  string local_2e8;
  string local_2c8 [32];
  string local_2a8;
  string local_288;
  string local_268;
  undefined1 local_244 [8];
  array<float,_3UL> a;
  string local_218;
  optional<tinyusdz::Animatable<std::array<float,_3UL>_>_> local_1f8;
  optional<tinyusdz::Animatable<std::array<float,_3UL>_>_> *local_1c0;
  optional<tinyusdz::Animatable<std::array<float,_3UL>_>_> *pv;
  stringstream local_1b0 [3];
  bool is_timesamples;
  bool has_timesamples;
  bool has_default;
  bool is_connection;
  bool is_value_empty;
  stringstream ss;
  ostream aoStack_1a0 [380];
  uint local_24;
  TypedAttribute<tinyusdz::Animatable<std::array<float,_3UL>_>_> *pTStack_20;
  uint32_t indent_local;
  string *name_local;
  TypedAttribute<tinyusdz::Animatable<std::array<float,_3UL>_>_> *attr_local;
  
  uVar6 = (uint)name;
  local_24 = uVar6;
  pTStack_20 = attr;
  name_local = (string *)this;
  attr_local = (TypedAttribute<tinyusdz::Animatable<std::array<float,_3UL>_>_> *)
               __return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1b0);
  bVar1 = TypedAttribute<tinyusdz::Animatable<std::array<float,_3UL>_>_>::authored
                    ((TypedAttribute<tinyusdz::Animatable<std::array<float,_3UL>_>_> *)name_local);
  if (bVar1) {
    pv._7_1_ = TypedAttribute<tinyusdz::Animatable<std::array<float,_3UL>_>_>::is_value_empty
                         ((TypedAttribute<tinyusdz::Animatable<std::array<float,_3UL>_>_> *)
                          name_local);
    pv._6_1_ = TypedAttribute<tinyusdz::Animatable<std::array<float,_3UL>_>_>::is_connection
                         ((TypedAttribute<tinyusdz::Animatable<std::array<float,_3UL>_>_> *)
                          name_local);
    pv._5_1_ = 0;
    pv._4_1_ = 0;
    pv._3_1_ = 0;
    TypedAttribute<tinyusdz::Animatable<std::array<float,_3UL>_>_>::get_value
              (&local_1f8,
               (TypedAttribute<tinyusdz::Animatable<std::array<float,_3UL>_>_> *)name_local);
    local_1c0 = &local_1f8;
    bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_1c0);
    uVar7 = (undefined3)(uVar6 >> 8);
    local_341 = false;
    if (bVar1) {
      pvVar4 = nonstd::optional_lite::optional<tinyusdz::Animatable<std::array<float,_3UL>_>_>::
               value(local_1c0);
      local_341 = Animatable<std::array<float,_3UL>_>::has_default(pvVar4);
    }
    pv._5_1_ = local_341;
    bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_1c0);
    local_342 = false;
    if (bVar1) {
      pvVar4 = nonstd::optional_lite::optional<tinyusdz::Animatable<std::array<float,_3UL>_>_>::
               value(local_1c0);
      local_342 = Animatable<std::array<float,_3UL>_>::has_timesamples(pvVar4);
    }
    pv._4_1_ = local_342;
    bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_1c0);
    indent_00 = CONCAT31(uVar7,bVar1);
    local_343 = false;
    if (bVar1) {
      pvVar4 = nonstd::optional_lite::optional<tinyusdz::Animatable<std::array<float,_3UL>_>_>::
               value(local_1c0);
      local_343 = Animatable<std::array<float,_3UL>_>::is_timesamples(pvVar4);
    }
    pv._3_1_ = local_343;
    pAVar2 = TypedAttribute<tinyusdz::Animatable<std::array<float,_3UL>_>_>::metas
                       ((TypedAttribute<tinyusdz::Animatable<std::array<float,_3UL>_>_> *)name_local
                       );
    bVar1 = AttrMetas::authored(pAVar2);
    uVar8 = extraout_EDX;
    if ((((bVar1) ||
         (bVar1 = TypedAttribute<tinyusdz::Animatable<std::array<float,_3UL>_>_>::is_blocked
                            ((TypedAttribute<tinyusdz::Animatable<std::array<float,_3UL>_>_> *)
                             name_local), uVar8 = extraout_EDX_00, bVar1)) || ((pv._5_1_ & 1) != 0))
       || (((pv._7_1_ & 1) != 0 || (((pv._6_1_ & 1) == 0 && ((pv._3_1_ & 1) == 0)))))) {
      pprint::Indent_abi_cxx11_(&local_218,(pprint *)(ulong)local_24,uVar8);
      ::std::operator<<(aoStack_1a0,(string *)&local_218);
      ::std::__cxx11::string::~string((string *)&local_218);
      value::TypeTraits<std::array<float,3ul>>::type_name_abi_cxx11_();
      poVar3 = ::std::operator<<(aoStack_1a0,(string *)(a._M_elems + 1));
      poVar3 = ::std::operator<<(poVar3," ");
      ::std::operator<<(poVar3,(string *)pTStack_20);
      ::std::__cxx11::string::~string((string *)(a._M_elems + 1));
      bVar1 = TypedAttribute<tinyusdz::Animatable<std::array<float,_3UL>_>_>::is_blocked
                        ((TypedAttribute<tinyusdz::Animatable<std::array<float,_3UL>_>_> *)
                         name_local);
      if (bVar1) {
        ::std::operator<<(aoStack_1a0," = None");
      }
      else if ((pv._5_1_ & 1) != 0) {
        pvVar4 = nonstd::optional_lite::optional<tinyusdz::Animatable<std::array<float,_3UL>_>_>::
                 value(local_1c0);
        bVar1 = Animatable<std::array<float,_3UL>_>::get_scalar
                          (pvVar4,(array<float,_3UL> *)local_244);
        if (bVar1) {
          poVar3 = ::std::operator<<(aoStack_1a0," = ");
          ::std::operator<<(poVar3,(float3 *)local_244);
        }
        else {
          ::std::operator<<(aoStack_1a0," = [InternalError]");
        }
      }
      pAVar2 = TypedAttribute<tinyusdz::Animatable<std::array<float,_3UL>_>_>::metas
                         ((TypedAttribute<tinyusdz::Animatable<std::array<float,_3UL>_>_> *)
                          name_local);
      bVar1 = AttrMetas::authored(pAVar2);
      if (bVar1) {
        poVar3 = ::std::operator<<(aoStack_1a0,"(\n");
        pAVar2 = TypedAttribute<tinyusdz::Animatable<std::array<float,_3UL>_>_>::metas
                           ((TypedAttribute<tinyusdz::Animatable<std::array<float,_3UL>_>_> *)
                            name_local);
        print_attr_metas_abi_cxx11_
                  (&local_268,(tinyusdz *)pAVar2,(AttrMeta *)(ulong)(local_24 + 1),indent_00);
        poVar3 = ::std::operator<<(poVar3,(string *)&local_268);
        pprint::Indent_abi_cxx11_(&local_288,(pprint *)(ulong)local_24,n);
        poVar3 = ::std::operator<<(poVar3,(string *)&local_288);
        ::std::operator<<(poVar3,")");
        ::std::__cxx11::string::~string((string *)&local_288);
        ::std::__cxx11::string::~string((string *)&local_268);
      }
      ::std::operator<<(aoStack_1a0,"\n");
      uVar8 = extraout_EDX_01;
    }
    if ((pv._4_1_ & 1) != 0) {
      pprint::Indent_abi_cxx11_(&local_2a8,(pprint *)(ulong)local_24,uVar8);
      ::std::operator<<(aoStack_1a0,(string *)&local_2a8);
      ::std::__cxx11::string::~string((string *)&local_2a8);
      value::TypeTraits<std::array<float,3ul>>::type_name_abi_cxx11_();
      poVar3 = ::std::operator<<(aoStack_1a0,local_2c8);
      poVar3 = ::std::operator<<(poVar3," ");
      ::std::operator<<(poVar3,(string *)pTStack_20);
      ::std::__cxx11::string::~string(local_2c8);
      poVar3 = ::std::operator<<(aoStack_1a0,".timeSamples = ");
      pvVar4 = nonstd::optional_lite::optional<tinyusdz::Animatable<std::array<float,_3UL>_>_>::
               value(local_1c0);
      this_00 = Animatable<std::array<float,_3UL>_>::get_timesamples(pvVar4);
      print_typed_timesamples<std::array<float,3ul>>
                (&local_2e8,(tinyusdz *)this_00,
                 (TypedTimeSamples<std::array<float,_3UL>_> *)(ulong)local_24,indent_00);
      ::std::operator<<(poVar3,(string *)&local_2e8);
      ::std::__cxx11::string::~string((string *)&local_2e8);
      ::std::operator<<(aoStack_1a0,"\n");
    }
    bVar1 = TypedAttribute<tinyusdz::Animatable<std::array<float,_3UL>_>_>::has_connections
                      ((TypedAttribute<tinyusdz::Animatable<std::array<float,_3UL>_>_> *)name_local)
    ;
    if (bVar1) {
      pprint::Indent_abi_cxx11_(&local_308,(pprint *)(ulong)local_24,n_00);
      ::std::operator<<(aoStack_1a0,(string *)&local_308);
      ::std::__cxx11::string::~string((string *)&local_308);
      value::TypeTraits<std::array<float,3ul>>::type_name_abi_cxx11_();
      poVar3 = ::std::operator<<(aoStack_1a0,(string *)&paths);
      poVar3 = ::std::operator<<(poVar3," ");
      ::std::operator<<(poVar3,(string *)pTStack_20);
      ::std::__cxx11::string::~string((string *)&paths);
      ::std::operator<<(aoStack_1a0,".connect = ");
      this_01 = TypedAttribute<tinyusdz::Animatable<std::array<float,_3UL>_>_>::get_connections
                          ((TypedAttribute<tinyusdz::Animatable<std::array<float,_3UL>_>_> *)
                           name_local);
      sVar5 = ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::size(this_01);
      if (sVar5 == 1) {
        v = ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator[](this_01,0);
        ::std::operator<<(aoStack_1a0,v);
      }
      else {
        sVar5 = ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::size(this_01);
        if (sVar5 == 0) {
          ::std::operator<<(aoStack_1a0,"[InternalError]");
        }
        else {
          ::std::operator<<(aoStack_1a0,this_01);
        }
      }
      ::std::operator<<(aoStack_1a0,"\n");
    }
    nonstd::optional_lite::optional<tinyusdz::Animatable<std::array<float,_3UL>_>_>::~optional
              (&local_1f8);
  }
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

std::string print_typed_attr(const TypedAttribute<Animatable<T>> &attr,
                             const std::string &name, const uint32_t indent) {
  std::stringstream ss;

  if (attr.authored()) {

    bool is_value_empty = attr.is_value_empty();
    bool is_connection = attr.is_connection();
    bool has_default{false};
    bool has_timesamples{false};
    bool is_timesamples{false};
    const auto &pv = attr.get_value();

    has_default = (pv && pv.value().has_default());
    has_timesamples = (pv && pv.value().has_timesamples());
    is_timesamples = (pv && pv.value().is_timesamples());

    DCOUT("name " << name);
    DCOUT("is_value_empty " << is_value_empty);
    DCOUT("is_connection " << is_connection);
    DCOUT("is_timesamples " << is_timesamples);
    DCOUT("has_timesamples " << has_timesamples);
    DCOUT("has_default " << has_default);

    //
    // Emit default value(includes ValueBlock and empty definition) and metada
    //
    // float a METADATA
    // float a = None METADATA
    // float a = 1.5 METADATA
    // 
    // Also emit this line if the attribute contains metadata
    // Do not emit when Attribute is connection only or timesamples only.
    if (attr.metas().authored() || attr.is_blocked() || has_default || is_value_empty || ((!is_connection) && (!is_timesamples))) {

      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;

      if (attr.is_blocked()) {
        ss << " = None";
      } else if (has_default) {
        T a;
        if (pv.value().get_scalar(&a)) {
          ss << " = " << a;
        } else {
          ss << " = [InternalError]";
        }
      } else { // is_value_empty
      }

      if (attr.metas().authored()) {
        ss << "(\n"
           << print_attr_metas(attr.metas(), indent + 1) << pprint::Indent(indent)
           << ")";
      }
      ss << "\n";
    }

    // timesamples
    if (has_timesamples) {
      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;
      ss << ".timeSamples = "
         << print_typed_timesamples(pv.value().get_timesamples(), indent);
      ss << "\n";
    }

    // connection
    if (attr.has_connections()) {

      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;

      ss << ".connect = ";
      const std::vector<Path> &paths = attr.get_connections();
      if (paths.size() == 1) {
        ss << paths[0];
      } else if (paths.size() == 0) {
        ss << "[InternalError]";
      } else {
        ss << paths;
      }
      ss << "\n";
    }

  }

  return ss.str();
}